

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VSpace_Serial(N_Vector v,sunindextype *lrw,sunindextype *liw)

{
  *lrw = *v->content;
  *liw = 1;
  return;
}

Assistant:

void N_VSpace_Serial(N_Vector v, sunindextype* lrw, sunindextype* liw)
{
  SUNFunctionBegin(v->sunctx);

  SUNAssertVoid(lrw, SUN_ERR_ARG_CORRUPT);
  SUNAssertVoid(liw, SUN_ERR_ARG_CORRUPT);

  *lrw = NV_LENGTH_S(v);
  *liw = 1;

  return;
}